

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionWrapperTestSuite.cpp
# Opt level: O1

bool checkFunctionSignature(void)

{
  return true;
}

Assistant:

bool checkFunctionSignature()
{
  bool testResult = false;

  {
    using barSig = int(Test::*)(int, float);
    testResult = std::is_same<barSig,
                              ::accessor::FunctionWrapper<Test, int, int, float>::type>::value;
  }

  {
    using foobarSig = int&(Test::*)(int&, float&, std::vector<int>, int*);
    testResult = std::is_same<foobarSig,
                             ::accessor::FunctionWrapper<Test, int&, int&, float&,
                                                         std::vector<int>, int*>::type>::value;
  }

  return testResult;
}